

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodetxb.c
# Opt level: O1

void av1_write_coeffs_txb
               (AV1_COMMON *cm,MACROBLOCK *x,aom_writer *w,int blk_row,int blk_col,int plane,
               int block,TX_SIZE tx_size)

{
  od_ec_enc *enc;
  tran_low_t *ptVar1;
  aom_cdf_prob (*paaVar2) [5];
  aom_cdf_prob (*icdf) [6];
  aom_cdf_prob (*icdf_00) [10];
  aom_cdf_prob (*icdf_01) [9];
  TX_CLASS tx_class;
  ushort uVar3;
  short sVar4;
  short sVar5;
  CB_COEFF_BUFFER *pCVar6;
  uint8_t *puVar7;
  FRAME_CONTEXT *pFVar8;
  MB_MODE_INFO *pMVar9;
  int16_t *scan;
  short sVar10;
  int iVar11;
  byte *pbVar12;
  int8_t *piVar13;
  ulong uVar14;
  ulong uVar15;
  aom_cdf_prob *paVar16;
  byte bVar17;
  byte bVar18;
  uint uVar19;
  uint uVar20;
  int iVar21;
  ulong uVar22;
  ushort uVar23;
  ushort uVar24;
  int iVar25;
  long lVar26;
  ulong uVar27;
  uint uVar28;
  ulong uVar29;
  char cVar30;
  int iVar31;
  int iVar32;
  ulong uVar33;
  long lVar34;
  ulong uVar35;
  aom_cdf_prob (*icdf_02) [8];
  uint16_t *puVar36;
  aom_cdf_prob (*icdf_03) [11];
  int iVar37;
  uint uVar38;
  aom_cdf_prob (*paaVar39) [3];
  bool bVar40;
  bool bVar41;
  uint8_t levels_buf [1312];
  int8_t coeff_contexts [4096];
  byte local_1558 [1312];
  int8_t local_1038 [4104];
  
  pCVar6 = x->cb_coef_buff;
  bVar41 = plane != 0;
  uVar22 = (ulong)bVar41;
  uVar33 = (ulong)(x->mbmi_ext_frame->cb_offset[uVar22] >> 4);
  uVar27 = (ulong)tx_size;
  lVar26 = (long)block;
  uVar24 = pCVar6->eobs[plane][uVar33 + lVar26];
  uVar15 = (ulong)uVar24;
  puVar7 = pCVar6->entropy_ctx[plane];
  uVar19 = (uint)""[uVar27] + (uint)""[uVar27] + 1 >> 1;
  uVar20 = uVar19 & 0xff;
  uVar29 = (ulong)uVar20;
  pFVar8 = (x->e_mbd).tile_ctx;
  paaVar39 = pFVar8->txb_skip_cdf[uVar29] + (puVar7[lVar26 + uVar33] & 0xf);
  enc = &w->ec;
  od_ec_encode_cdf_q15(enc,(uint)(uVar24 == 0),*paaVar39,2);
  if (w->allow_update_cdf != '\0') {
    uVar23 = (*paaVar39)[2];
    bVar17 = (char)(uVar23 >> 4) + 4;
    uVar3 = (*paaVar39)[0];
    if (uVar24 == 0) {
      sVar4 = (short)((int)(0x8000 - (uint)uVar3) >> (bVar17 & 0x1f));
    }
    else {
      sVar4 = -(uVar3 >> (bVar17 & 0x1f));
    }
    (*paaVar39)[0] = uVar3 + sVar4;
    (*paaVar39)[2] = (*paaVar39)[2] + (ushort)(uVar23 < 0x20);
  }
  if (uVar24 == 0) {
    return;
  }
  pMVar9 = *(x->e_mbd).mi;
  if (((x->e_mbd).lossless[*(ushort *)&pMVar9->field_0xa7 & 7] == 0) &&
     ((0x61810UL >> (uVar27 & 0x3f) & 1) == 0)) {
    if (plane == 0) {
      bVar17 = (x->e_mbd).tx_type_map[blk_row * (x->e_mbd).tx_type_map_stride + blk_col];
    }
    else {
      cVar30 = (char)*(ushort *)&pMVar9->field_0xa7;
      if ((cVar30 < '\0') || ('\0' < pMVar9->ref_frame[0])) {
        pbVar12 = (x->e_mbd).tx_type_map +
                  ((blk_row << ((byte)(x->e_mbd).plane[uVar22].subsampling_y & 0x1f)) *
                   (x->e_mbd).tx_type_map_stride +
                  (blk_col << ((byte)(x->e_mbd).plane[uVar22].subsampling_x & 0x1f)));
      }
      else {
        pbVar12 = intra_mode_to_tx_type__intra_mode_to_tx_type +
                  (byte)get_uv_mode_uv2y[pMVar9->uv_mode];
      }
      uVar28 = 1;
      if (-1 < cVar30) {
        uVar28 = (uint)('\0' < pMVar9->ref_frame[0]);
      }
      if ((0x18608UL >> (uVar27 & 0x3f) & 1) == 0) {
        if ((cm->features).reduced_tx_set_used == false) {
          uVar28 = (uint)av1_ext_tx_set_lookup[0]
                         [(ulong)((0x60604UL >> (uVar27 & 0x3f) & 1) != 0) + (ulong)(uVar28 * 2)];
        }
        else {
          uVar28 = (uint)(byte)((uVar28 == 0) + 1);
        }
      }
      uVar28 = *(uint *)((long)av1_ext_tx_used[0] + (ulong)*pbVar12 * 4 + (ulong)(uVar28 << 6));
      if (uVar28 != 0) {
        uVar28 = (uint)*pbVar12;
      }
      bVar17 = (byte)uVar28;
    }
  }
  else {
    bVar17 = 0;
  }
  if (plane == 0) {
    av1_write_tx_type(cm,&x->e_mbd,bVar17,tx_size,w);
  }
  if (uVar24 < 0x21) {
    piVar13 = "";
  }
  else {
    uVar28 = uVar24 - 1 >> 5;
    uVar15 = 0x10;
    if (uVar28 < 0x10) {
      uVar15 = (ulong)uVar28;
    }
    piVar13 = "\x06\a\b\b\t\t\t\t\n\n\n\n\n\n\n\n\v";
  }
  iVar11 = (int)piVar13[uVar15];
  sVar4 = av1_eob_group_start[iVar11];
  bVar40 = 9 < bVar17;
  uVar15 = (ulong)bVar40;
  iVar37 = iVar11 + -1;
  tx_class = ""[bVar17];
  cVar30 = (char)iVar37;
  switch(""[uVar27]) {
  case '\0':
    icdf = pFVar8->eob_flag_cdf16[uVar22] + uVar15;
    od_ec_encode_cdf_q15(enc,iVar37,*icdf,5);
    if (w->allow_update_cdf != '\0') {
      paVar16 = *icdf + 5;
      uVar23 = (*icdf)[5];
      bVar18 = (char)(uVar23 >> 4) + 5;
      lVar34 = 0;
      do {
        uVar3 = (*icdf)[lVar34];
        if (lVar34 < cVar30) {
          sVar5 = (short)((int)(0x8000 - (uint)uVar3) >> (bVar18 & 0x1f));
        }
        else {
          sVar5 = -(uVar3 >> (bVar18 & 0x1f));
        }
        (*icdf)[lVar34] = sVar5 + uVar3;
        lVar34 = lVar34 + 1;
      } while (lVar34 != 4);
LAB_001ca924:
      *paVar16 = *paVar16 + (ushort)(uVar23 < 0x20);
    }
    break;
  case '\x01':
    lVar34 = (ulong)bVar40 * 0x10 + uVar15 * -2 + uVar22 * 0x1c;
    puVar36 = (uint16_t *)((long)pFVar8 + lVar34 + 0x3f6);
    od_ec_encode_cdf_q15(enc,iVar37,puVar36,6);
    if (w->allow_update_cdf != '\0') {
      paVar16 = (aom_cdf_prob *)((long)pFVar8 + lVar34 + 0x402);
      uVar23 = *(ushort *)((long)pFVar8 + lVar34 + 0x402);
      bVar18 = (char)(uVar23 >> 4) + 5;
      lVar34 = 0;
      do {
        uVar3 = puVar36[lVar34];
        if (lVar34 < cVar30) {
          sVar5 = (short)((int)(0x8000 - (uint)uVar3) >> (bVar18 & 0x1f));
        }
        else {
          sVar5 = -(uVar3 >> (bVar18 & 0x1f));
        }
        puVar36[lVar34] = sVar5 + uVar3;
        lVar34 = lVar34 + 1;
      } while (lVar34 != 5);
      goto LAB_001ca924;
    }
    break;
  case '\x02':
    icdf_02 = pFVar8->eob_flag_cdf64[bVar41] + bVar40;
    od_ec_encode_cdf_q15(enc,iVar37,*icdf_02,7);
    if (w->allow_update_cdf != '\0') {
      paVar16 = pFVar8->eob_flag_cdf64[bVar41][bVar40] + 7;
      uVar23 = pFVar8->eob_flag_cdf64[bVar41][bVar40][7];
      bVar18 = (char)(uVar23 >> 4) + 5;
      lVar34 = 0;
      do {
        uVar3 = (*icdf_02)[lVar34];
        if (lVar34 < cVar30) {
          sVar5 = (short)((int)(0x8000 - (uint)uVar3) >> (bVar18 & 0x1f));
        }
        else {
          sVar5 = -(uVar3 >> (bVar18 & 0x1f));
        }
        (*icdf_02)[lVar34] = sVar5 + uVar3;
        lVar34 = lVar34 + 1;
      } while (lVar34 != 6);
      goto LAB_001ca924;
    }
    break;
  case '\x03':
    icdf_01 = pFVar8->eob_flag_cdf128[uVar22] + uVar15;
    od_ec_encode_cdf_q15(enc,iVar37,*icdf_01,8);
    if (w->allow_update_cdf != '\0') {
      paVar16 = *icdf_01 + 8;
      uVar23 = (*icdf_01)[8];
      bVar18 = (char)(uVar23 >> 4) + 5;
      lVar34 = 0;
      do {
        uVar3 = (*icdf_01)[lVar34];
        if (lVar34 < cVar30) {
          sVar5 = (short)((int)(0x8000 - (uint)uVar3) >> (bVar18 & 0x1f));
        }
        else {
          sVar5 = -(uVar3 >> (bVar18 & 0x1f));
        }
        (*icdf_01)[lVar34] = sVar5 + uVar3;
        lVar34 = lVar34 + 1;
      } while (lVar34 != 7);
      goto LAB_001ca924;
    }
    break;
  case '\x04':
    icdf_00 = pFVar8->eob_flag_cdf256[uVar22] + uVar15;
    od_ec_encode_cdf_q15(enc,iVar37,*icdf_00,9);
    if (w->allow_update_cdf != '\0') {
      paVar16 = *icdf_00 + 9;
      uVar23 = (*icdf_00)[9];
      bVar18 = (char)(uVar23 >> 4) + 5;
      lVar34 = 0;
      do {
        uVar3 = (*icdf_00)[lVar34];
        if (lVar34 < cVar30) {
          sVar5 = (short)((int)(0x8000 - (uint)uVar3) >> (bVar18 & 0x1f));
        }
        else {
          sVar5 = -(uVar3 >> (bVar18 & 0x1f));
        }
        (*icdf_00)[lVar34] = sVar5 + uVar3;
        lVar34 = lVar34 + 1;
      } while (lVar34 != 8);
      goto LAB_001ca924;
    }
    break;
  case '\x05':
    icdf_03 = pFVar8->eob_flag_cdf512[uVar22] + uVar15;
    od_ec_encode_cdf_q15(enc,iVar37,*icdf_03,10);
    if (w->allow_update_cdf != '\0') {
      paVar16 = pFVar8->eob_flag_cdf512[uVar22][uVar15] + 10;
      uVar23 = pFVar8->eob_flag_cdf512[uVar22][uVar15][10];
      bVar18 = (char)(uVar23 >> 4) + 5;
      lVar34 = 0;
      do {
        uVar3 = (*icdf_03)[lVar34];
        if (lVar34 < cVar30) {
          sVar5 = (short)((int)(0x8000 - (uint)uVar3) >> (bVar18 & 0x1f));
        }
        else {
          sVar5 = -(uVar3 >> (bVar18 & 0x1f));
        }
        (*icdf_03)[lVar34] = sVar5 + uVar3;
        lVar34 = lVar34 + 1;
      } while (lVar34 != 9);
      goto LAB_001ca924;
    }
    break;
  default:
    uVar14 = (ulong)((uint)bVar41 * 0x30);
    puVar36 = (uint16_t *)((long)pFVar8->eob_flag_cdf1024[0][uVar15] + uVar14);
    od_ec_encode_cdf_q15(enc,iVar37,puVar36,0xb);
    if (w->allow_update_cdf != '\0') {
      paVar16 = (aom_cdf_prob *)((long)pFVar8->eob_flag_cdf1024[0][uVar15] + uVar14 + 0x16);
      uVar23 = *(ushort *)((long)pFVar8->eob_flag_cdf1024[0][uVar15] + uVar14 + 0x16);
      bVar18 = (char)(uVar23 >> 4) + 5;
      lVar34 = 0;
      do {
        uVar3 = puVar36[lVar34];
        if (lVar34 < cVar30) {
          sVar5 = (short)((int)(0x8000 - (uint)uVar3) >> (bVar18 & 0x1f));
        }
        else {
          sVar5 = -(uVar3 >> (bVar18 & 0x1f));
        }
        puVar36[lVar34] = sVar5 + uVar3;
        lVar34 = lVar34 + 1;
      } while (lVar34 != 10);
      goto LAB_001ca924;
    }
  }
  sVar5 = av1_eob_offset_bits[iVar11];
  iVar37 = (int)sVar5;
  if (0 < sVar5) {
    uVar28 = (uint)(((uint)uVar24 - (int)sVar4 >> (iVar37 - 1U & 0x1f) & 1) != 0);
    paaVar39 = pFVar8->eob_extra_cdf[uVar29 - 1][uVar22 + 1] + (long)iVar11 + 6;
    od_ec_encode_cdf_q15(enc,uVar28,*paaVar39,2);
    if (w->allow_update_cdf != '\0') {
      uVar23 = pFVar8->eob_extra_cdf[uVar29 - 1][uVar22 + 1][(long)iVar11 + 6][2];
      bVar18 = (char)(uVar23 >> 4) + 4;
      uVar3 = (*paaVar39)[0];
      if (uVar28 == 0) {
        sVar10 = -(uVar3 >> (bVar18 & 0x1f));
      }
      else {
        sVar10 = (short)((int)(0x8000 - (uint)uVar3) >> (bVar18 & 0x1f));
      }
      (*paaVar39)[0] = uVar3 + sVar10;
      paVar16 = pFVar8->eob_extra_cdf[uVar29 - 1][uVar22 + 1][(long)iVar11 + 6] + 2;
      *paVar16 = *paVar16 + (ushort)(uVar23 < 0x20);
    }
    if (sVar5 != 1) {
      iVar11 = 2;
      if (2 < iVar37) {
        iVar11 = iVar37;
      }
      iVar11 = iVar11 + -1;
      uVar28 = iVar37 - 2;
      do {
        od_ec_encode_bool_q15
                  (enc,(uint)(((uint)uVar24 - (int)sVar4 >> (uVar28 & 0x1f) & 1) != 0),0x4000);
        uVar28 = uVar28 - 1;
        iVar11 = iVar11 + -1;
      } while (iVar11 != 0);
    }
  }
  uVar38 = (uint)tx_size;
  uVar28 = (uint)uVar24;
  if (tx_size < 0x11) {
    uVar15 = 3;
    if ((1 < uVar38 - 0xb) && (uVar38 != 4)) {
LAB_001caa5f:
      uVar15 = uVar27;
    }
  }
  else if (uVar38 == 0x11) {
    uVar15 = 9;
  }
  else {
    if (uVar38 != 0x12) goto LAB_001caa5f;
    uVar15 = 10;
  }
  if (tx_size < 0x11) {
    uVar14 = 3;
    if ((1 < uVar38 - 0xb) && (uVar38 != 4)) {
LAB_001caaa3:
      uVar14 = uVar27;
    }
  }
  else if (uVar38 == 0x11) {
    uVar14 = 9;
  }
  else {
    if (uVar38 != 0x12) goto LAB_001caaa3;
    uVar14 = 10;
  }
  ptVar1 = pCVar6->tcoeff[plane] + (ulong)x->mbmi_ext_frame->cb_offset[uVar22] + (long)(block << 4);
  (*av1_txb_init_levels)(ptVar1,tx_size_wide[uVar15],tx_size_high[uVar14],local_1558);
  scan = av1_scan_orders[tx_size][bVar17].scan;
  av1_get_nz_map_contexts_sse2(local_1558,scan,uVar24,tx_size,tx_class,local_1038);
  if (tx_size < 0x11) {
    uVar15 = 3;
    if ((uVar38 - 0xb < 2) || (uVar38 == 4)) goto LAB_001cab71;
  }
  else {
    if (uVar38 == 0x11) {
      uVar15 = 9;
      goto LAB_001cab71;
    }
    if (uVar38 == 0x12) {
      uVar15 = 10;
      goto LAB_001cab71;
    }
  }
  uVar15 = uVar27;
LAB_001cab71:
  uVar14 = (ulong)(uVar28 - 1);
  bVar17 = (byte)tx_size_high_log2[uVar15];
  iVar11 = 1 << (bVar17 & 0x1f);
  iVar37 = iVar11 + 4;
  uVar15 = uVar14;
  uVar27 = uVar29;
  if (2 < (byte)uVar19) {
    uVar27 = 3;
  }
  do {
    sVar4 = scan[uVar15];
    uVar19 = ptVar1[sVar4];
    uVar38 = -uVar19;
    if (0 < (int)uVar19) {
      uVar38 = uVar19;
    }
    uVar19 = 3;
    if (uVar38 < 3) {
      uVar19 = uVar38;
    }
    if (uVar15 == uVar14) {
      puVar36 = (uint16_t *)
                ((long)pFVar8->coeff_base_eob_cdf[0][bVar41][local_1038[sVar4]] +
                (ulong)(uVar20 << 6));
      od_ec_encode_cdf_q15(enc,uVar19 - 1,puVar36,3);
      if (w->allow_update_cdf != '\0') {
        paVar16 = puVar36 + 3;
        uVar24 = puVar36[3];
        bVar18 = (char)(uVar24 >> 4) + 4;
        lVar34 = 0;
        do {
          uVar23 = puVar36[lVar34];
          if (lVar34 < (char)(uVar19 - 1)) {
            sVar5 = (short)((int)(0x8000 - (uint)uVar23) >> (bVar18 & 0x1f));
          }
          else {
            sVar5 = -(uVar23 >> (bVar18 & 0x1f));
          }
          puVar36[lVar34] = sVar5 + uVar23;
          lVar34 = lVar34 + 1;
        } while (lVar34 != 2);
LAB_001cad4c:
        *paVar16 = *paVar16 + (ushort)(uVar24 < 0x20);
      }
    }
    else {
      paaVar2 = pFVar8->coeff_base_cdf[uVar29][uVar22] + local_1038[sVar4];
      od_ec_encode_cdf_q15(enc,uVar19,*paaVar2,4);
      if (w->allow_update_cdf != '\0') {
        paVar16 = *paaVar2 + 4;
        uVar24 = (*paaVar2)[4];
        bVar18 = (char)(uVar24 >> 4) + 5;
        uVar35 = 0;
        do {
          uVar23 = (*paaVar2)[uVar35];
          if (uVar35 < uVar19) {
            sVar5 = (short)((int)(0x8000 - (uint)uVar23) >> (bVar18 & 0x1f));
          }
          else {
            sVar5 = -(uVar23 >> (bVar18 & 0x1f));
          }
          (*paaVar2)[uVar35] = sVar5 + uVar23;
          uVar35 = uVar35 + 1;
        } while (uVar35 != 3);
        goto LAB_001cad4c;
      }
    }
    if (2 < uVar38) {
      iVar25 = (int)sVar4 >> (bVar17 & 0x1f);
      iVar31 = iVar25 << (bVar17 & 0x1f);
      iVar21 = sVar4 - iVar31;
      iVar32 = iVar25 * iVar37 + iVar21;
      lVar34 = (long)(iVar37 + iVar32);
      uVar19 = (uint)local_1558[lVar34] + (uint)local_1558[(long)iVar32 + 1];
      if (tx_class == '\x02') {
        uVar19 = uVar19 + local_1558[(long)iVar32 + 2] + 1 >> 1;
        if (5 < uVar19) {
          uVar19 = 6;
        }
        if (sVar4 != 0) {
          if (sVar4 != iVar31) goto LAB_001cae02;
LAB_001cae2a:
          uVar19 = uVar19 + 7;
        }
      }
      else {
        if (tx_class == '\x01') {
          uVar19 = uVar19 + local_1558[iVar32 + iVar11 * 2 + 8] + 1 >> 1;
          if (5 < uVar19) {
            uVar19 = 6;
          }
          if (sVar4 == 0) goto LAB_001cae2d;
          if (iVar25 == 0) goto LAB_001cae2a;
        }
        else if (tx_class == '\0') {
          uVar19 = uVar19 + local_1558[lVar34 + 1] + 1 >> 1;
          if (5 < uVar19) {
            uVar19 = 6;
          }
          if (sVar4 == 0) goto LAB_001cae2d;
          if ((iVar25 < 2) && (iVar21 < 2)) goto LAB_001cae2a;
        }
LAB_001cae02:
        uVar19 = uVar19 + 0xe;
      }
LAB_001cae2d:
      paaVar2 = pFVar8->coeff_br_cdf[uVar27][uVar22] + uVar19;
      uVar19 = 0;
      do {
        iVar25 = (uVar38 - 3) - uVar19;
        iVar21 = 3;
        if (iVar25 < 3) {
          iVar21 = iVar25;
        }
        od_ec_encode_cdf_q15(enc,iVar21,*paaVar2,4);
        if (w->allow_update_cdf != '\0') {
          uVar24 = (*paaVar2)[4];
          bVar18 = (char)(uVar24 >> 4) + 5;
          lVar34 = 0;
          do {
            uVar23 = (*paaVar2)[lVar34];
            if (lVar34 < (char)iVar21) {
              sVar4 = (short)((int)(0x8000 - (uint)uVar23) >> (bVar18 & 0x1f));
            }
            else {
              sVar4 = -(uVar23 >> (bVar18 & 0x1f));
            }
            (*paaVar2)[lVar34] = sVar4 + uVar23;
            lVar34 = lVar34 + 1;
          } while (lVar34 != 3);
          (*paaVar2)[4] = (*paaVar2)[4] + (ushort)(uVar24 < 0x20);
        }
      } while ((2 < iVar25) && (bVar40 = uVar19 < 9, uVar19 = uVar19 + 3, bVar40));
    }
    iVar21 = (int)uVar15;
    uVar15 = uVar15 - 1;
    if (iVar21 < 1) {
      uVar29 = 0;
      do {
        uVar19 = ptVar1[scan[uVar29]];
        uVar20 = -uVar19;
        if (0 < (int)uVar19) {
          uVar20 = uVar19;
        }
        if (uVar19 != 0) {
          if (uVar29 == 0) {
            paaVar39 = pFVar8->dc_sign_cdf[uVar22] + (puVar7[lVar26 + uVar33] >> 4 & 3);
            od_ec_encode_cdf_q15(enc,uVar19 >> 0x1f,*paaVar39,2);
            if (w->allow_update_cdf != '\0') {
              uVar24 = (*paaVar39)[2];
              bVar17 = (char)(uVar24 >> 4) + 4;
              uVar23 = (*paaVar39)[0];
              if ((int)uVar19 < 0) {
                sVar4 = (short)((int)(0x8000 - (uint)uVar23) >> (bVar17 & 0x1f));
              }
              else {
                sVar4 = -(uVar23 >> (bVar17 & 0x1f));
              }
              (*paaVar39)[0] = uVar23 + sVar4;
              (*paaVar39)[2] = (*paaVar39)[2] + (ushort)(uVar24 < 0x20);
            }
          }
          else {
            od_ec_encode_bool_q15(enc,uVar19 >> 0x1f,0x4000);
          }
          if (0xe < uVar20) {
            uVar19 = uVar20 - 0xe >> 1;
            if (uVar19 == 0) {
              uVar38 = 0x20;
            }
            else {
              uVar38 = 0x1f;
              if (uVar19 != 0) {
                for (; uVar19 >> uVar38 == 0; uVar38 = uVar38 - 1) {
                }
              }
              uVar38 = uVar38 ^ 0x1f;
            }
            if (uVar20 != 0xf) {
              iVar11 = uVar38 - 0x20;
              do {
                od_ec_encode_bool_q15(enc,0,0x4000);
                iVar11 = iVar11 + 1;
              } while (iVar11 != 0);
            }
            uVar38 = 0x21 - uVar38;
            do {
              uVar38 = uVar38 - 1;
              od_ec_encode_bool_q15(enc,(uint)((uVar20 - 0xe >> (uVar38 & 0x1f) & 1) != 0),0x4000);
            } while (0 < (int)uVar38);
          }
        }
        uVar29 = uVar29 + 1;
      } while (uVar29 != uVar28 + (uVar28 == 0));
      return;
    }
  } while( true );
}

Assistant:

void av1_write_coeffs_txb(const AV1_COMMON *const cm, MACROBLOCK *const x,
                          aom_writer *w, int blk_row, int blk_col, int plane,
                          int block, TX_SIZE tx_size) {
  MACROBLOCKD *xd = &x->e_mbd;
  const CB_COEFF_BUFFER *cb_coef_buff = x->cb_coef_buff;
  const PLANE_TYPE plane_type = get_plane_type(plane);
  const int txb_offset = x->mbmi_ext_frame->cb_offset[plane_type] /
                         (TX_SIZE_W_MIN * TX_SIZE_H_MIN);
  const uint16_t *eob_txb = cb_coef_buff->eobs[plane] + txb_offset;
  const uint16_t eob = eob_txb[block];
  const uint8_t *entropy_ctx = cb_coef_buff->entropy_ctx[plane] + txb_offset;
  const int txb_skip_ctx = entropy_ctx[block] & TXB_SKIP_CTX_MASK;
  const TX_SIZE txs_ctx = get_txsize_entropy_ctx(tx_size);
  FRAME_CONTEXT *ec_ctx = xd->tile_ctx;
  aom_write_symbol(w, eob == 0, ec_ctx->txb_skip_cdf[txs_ctx][txb_skip_ctx], 2);
  if (eob == 0) return;

  const TX_TYPE tx_type =
      av1_get_tx_type(xd, plane_type, blk_row, blk_col, tx_size,
                      cm->features.reduced_tx_set_used);
  // Only y plane's tx_type is transmitted
  if (plane == 0) {
    av1_write_tx_type(cm, xd, tx_type, tx_size, w);
  }

  int eob_extra;
  const int eob_pt = av1_get_eob_pos_token(eob, &eob_extra);
  const int eob_multi_size = txsize_log2_minus4[tx_size];
  const TX_CLASS tx_class = tx_type_to_class[tx_type];
  const int eob_multi_ctx = (tx_class == TX_CLASS_2D) ? 0 : 1;
  switch (eob_multi_size) {
    case 0:
      aom_write_symbol(w, eob_pt - 1,
                       ec_ctx->eob_flag_cdf16[plane_type][eob_multi_ctx], 5);
      break;
    case 1:
      aom_write_symbol(w, eob_pt - 1,
                       ec_ctx->eob_flag_cdf32[plane_type][eob_multi_ctx], 6);
      break;
    case 2:
      aom_write_symbol(w, eob_pt - 1,
                       ec_ctx->eob_flag_cdf64[plane_type][eob_multi_ctx], 7);
      break;
    case 3:
      aom_write_symbol(w, eob_pt - 1,
                       ec_ctx->eob_flag_cdf128[plane_type][eob_multi_ctx], 8);
      break;
    case 4:
      aom_write_symbol(w, eob_pt - 1,
                       ec_ctx->eob_flag_cdf256[plane_type][eob_multi_ctx], 9);
      break;
    case 5:
      aom_write_symbol(w, eob_pt - 1,
                       ec_ctx->eob_flag_cdf512[plane_type][eob_multi_ctx], 10);
      break;
    default:
      aom_write_symbol(w, eob_pt - 1,
                       ec_ctx->eob_flag_cdf1024[plane_type][eob_multi_ctx], 11);
      break;
  }

  const int eob_offset_bits = av1_eob_offset_bits[eob_pt];
  if (eob_offset_bits > 0) {
    const int eob_ctx = eob_pt - 3;
    int eob_shift = eob_offset_bits - 1;
    int bit = (eob_extra & (1 << eob_shift)) ? 1 : 0;
    aom_write_symbol(w, bit,
                     ec_ctx->eob_extra_cdf[txs_ctx][plane_type][eob_ctx], 2);
    for (int i = 1; i < eob_offset_bits; i++) {
      eob_shift = eob_offset_bits - 1 - i;
      bit = (eob_extra & (1 << eob_shift)) ? 1 : 0;
      aom_write_bit(w, bit);
    }
  }

  const int width = get_txb_wide(tx_size);
  const int height = get_txb_high(tx_size);
  uint8_t levels_buf[TX_PAD_2D];
  uint8_t *const levels = set_levels(levels_buf, height);
  const tran_low_t *tcoeff_txb =
      cb_coef_buff->tcoeff[plane] + x->mbmi_ext_frame->cb_offset[plane_type];
  const tran_low_t *tcoeff = tcoeff_txb + BLOCK_OFFSET(block);
  av1_txb_init_levels(tcoeff, width, height, levels);
  const SCAN_ORDER *const scan_order = get_scan(tx_size, tx_type);
  const int16_t *const scan = scan_order->scan;
  DECLARE_ALIGNED(16, int8_t, coeff_contexts[MAX_TX_SQUARE]);
  av1_get_nz_map_contexts(levels, scan, eob, tx_size, tx_class, coeff_contexts);

  const int bhl = get_txb_bhl(tx_size);
  for (int c = eob - 1; c >= 0; --c) {
    const int pos = scan[c];
    const int coeff_ctx = coeff_contexts[pos];
    const tran_low_t v = tcoeff[pos];
    const tran_low_t level = abs(v);

    if (c == eob - 1) {
      aom_write_symbol(
          w, AOMMIN(level, 3) - 1,
          ec_ctx->coeff_base_eob_cdf[txs_ctx][plane_type][coeff_ctx], 3);
    } else {
      aom_write_symbol(w, AOMMIN(level, 3),
                       ec_ctx->coeff_base_cdf[txs_ctx][plane_type][coeff_ctx],
                       4);
    }
    if (level > NUM_BASE_LEVELS) {
      // level is above 1.
      const int base_range = level - 1 - NUM_BASE_LEVELS;
      const int br_ctx = get_br_ctx(levels, pos, bhl, tx_class);
      aom_cdf_prob *cdf =
          ec_ctx->coeff_br_cdf[AOMMIN(txs_ctx, TX_32X32)][plane_type][br_ctx];
      for (int idx = 0; idx < COEFF_BASE_RANGE; idx += BR_CDF_SIZE - 1) {
        const int k = AOMMIN(base_range - idx, BR_CDF_SIZE - 1);
        aom_write_symbol(w, k, cdf, BR_CDF_SIZE);
        if (k < BR_CDF_SIZE - 1) break;
      }
    }
  }

  // Loop to code all signs in the transform block,
  // starting with the sign of DC (if applicable)
  for (int c = 0; c < eob; ++c) {
    const tran_low_t v = tcoeff[scan[c]];
    const tran_low_t level = abs(v);
    const int sign = (v < 0) ? 1 : 0;
    if (level) {
      if (c == 0) {
        const int dc_sign_ctx =
            (entropy_ctx[block] >> DC_SIGN_CTX_SHIFT) & DC_SIGN_CTX_MASK;
        aom_write_symbol(w, sign, ec_ctx->dc_sign_cdf[plane_type][dc_sign_ctx],
                         2);
      } else {
        aom_write_bit(w, sign);
      }
      if (level > COEFF_BASE_RANGE + NUM_BASE_LEVELS)
        write_golomb(w, level - COEFF_BASE_RANGE - 1 - NUM_BASE_LEVELS);
    }
  }
}